

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O0

void __thiscall onmt::SentencePieceLearner::~SentencePieceLearner(SentencePieceLearner *this)

{
  SentencePieceLearner *in_RDI;
  
  ~SentencePieceLearner(in_RDI);
  operator_delete(in_RDI,0x78);
  return;
}

Assistant:

SentencePieceLearner::~SentencePieceLearner()
  {
    if (!_keep_input_file) {
      remove(_input_filename.c_str());
    }
  }